

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

void __thiscall r_code::SysObject::trace(SysObject *this)

{
  ostream *poVar1;
  size_t sVar2;
  Atom *pAVar3;
  uint *puVar4;
  SysView **ppSVar5;
  ulong local_28;
  size_t j;
  size_t k;
  size_t i;
  SysObject *this_local;
  
  std::operator<<((ostream *)&std::cout,"\n---object---\n");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,this->oid);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"code size: ");
  sVar2 = vector<r_code::Atom>::size(&(this->super_ImageObject).code);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,sVar2);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"reference set size: ");
  sVar2 = vector<unsigned_int>::size(&(this->super_ImageObject).references);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,sVar2);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"marker set size: ");
  sVar2 = vector<unsigned_int>::size(&this->markers);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,sVar2);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"view set size: ");
  sVar2 = vector<r_code::SysView_*>::size(&this->views);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,sVar2);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,"\n---code---\n");
  k = 0;
  while( true ) {
    sVar2 = vector<r_code::Atom>::size(&(this->super_ImageObject).code);
    if (sVar2 <= k) break;
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,k);
    std::operator<<(poVar1," ");
    pAVar3 = vector<r_code::Atom>::operator[](&(this->super_ImageObject).code,k);
    Atom::trace(pAVar3);
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    k = k + 1;
  }
  std::operator<<((ostream *)&std::cout,"\n---reference set---\n");
  k = 0;
  while( true ) {
    sVar2 = vector<unsigned_int>::size(&(this->super_ImageObject).references);
    if (sVar2 <= k) break;
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,k);
    poVar1 = std::operator<<(poVar1," ");
    puVar4 = vector<unsigned_int>::operator[](&(this->super_ImageObject).references,k);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*puVar4);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    k = k + 1;
  }
  std::operator<<((ostream *)&std::cout,"\n---marker set---\n");
  k = 0;
  while( true ) {
    sVar2 = vector<unsigned_int>::size(&this->markers);
    if (sVar2 <= k) break;
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,k);
    poVar1 = std::operator<<(poVar1," ");
    puVar4 = vector<unsigned_int>::operator[](&this->markers,k);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*puVar4);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    k = k + 1;
  }
  std::operator<<((ostream *)&std::cout,"\n---view set---\n");
  j = 0;
  while( true ) {
    sVar2 = vector<r_code::SysView_*>::size(&this->views);
    if (sVar2 <= j) break;
    poVar1 = std::operator<<((ostream *)&std::cout,"view[");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,j);
    poVar1 = std::operator<<(poVar1,"]");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<((ostream *)&std::cout,"reference set size: ");
    ppSVar5 = vector<r_code::SysView_*>::operator[](&this->views,j);
    sVar2 = vector<unsigned_int>::size(&((*ppSVar5)->super_ImageObject).references);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,sVar2);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<((ostream *)&std::cout,"-code-");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    local_28 = 0;
    while( true ) {
      ppSVar5 = vector<r_code::SysView_*>::operator[](&this->views,j);
      sVar2 = vector<r_code::Atom>::size(&((*ppSVar5)->super_ImageObject).code);
      if (sVar2 <= local_28) break;
      poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_28);
      std::operator<<(poVar1," ");
      ppSVar5 = vector<r_code::SysView_*>::operator[](&this->views,j);
      pAVar3 = vector<r_code::Atom>::operator[](&((*ppSVar5)->super_ImageObject).code,local_28);
      Atom::trace(pAVar3);
      std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
      local_28 = local_28 + 1;
    }
    poVar1 = std::operator<<((ostream *)&std::cout,"-reference set-");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    local_28 = 0;
    while( true ) {
      ppSVar5 = vector<r_code::SysView_*>::operator[](&this->views,j);
      sVar2 = vector<unsigned_int>::size(&((*ppSVar5)->super_ImageObject).references);
      if (sVar2 <= local_28) break;
      poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_28);
      poVar1 = std::operator<<(poVar1," ");
      ppSVar5 = vector<r_code::SysView_*>::operator[](&this->views,j);
      puVar4 = vector<unsigned_int>::operator[]
                         (&((*ppSVar5)->super_ImageObject).references,local_28);
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,*puVar4);
      std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
      local_28 = local_28 + 1;
    }
    j = j + 1;
  }
  return;
}

Assistant:

void SysObject::trace()
{
    std::cout << "\n---object---\n";
    std::cout << oid << std::endl;
    std::cout << "code size: " << code.size() << std::endl;
    std::cout << "reference set size: " << references.size() << std::endl;
    std::cout << "marker set size: " << markers.size() << std::endl;
    std::cout << "view set size: " << views.size() << std::endl;
    std::cout << "\n---code---\n";
    size_t i;

    for (i = 0; i < code.size(); ++i) {
        std::cout << i << " ";
        code[i].trace();
        std::cout << std::endl;
    }

    std::cout << "\n---reference set---\n";

    for (i = 0; i < references.size(); ++i) {
        std::cout << i << " " << references[i] << std::endl;
    }

    std::cout << "\n---marker set---\n";

    for (i = 0; i < markers.size(); ++i) {
        std::cout << i << " " << markers[i] << std::endl;
    }

    std::cout << "\n---view set---\n";

    for (size_t k = 0; k < views.size(); ++k) {
        std::cout << "view[" << k << "]" << std::endl;
        std::cout << "reference set size: " << views[k]->references.size() << std::endl;
        std::cout << "-code-" << std::endl;
        size_t j;

        for (j = 0; j < views[k]->code.size(); ++i, ++j) {
            std::cout << j << " ";
            views[k]->code[j].trace();
            std::cout << std::endl;
        }

        std::cout << "-reference set-" << std::endl;

        for (j = 0; j < views[k]->references.size(); ++i, ++j) {
            std::cout << j << " " << views[k]->references[j] << std::endl;
        }
    }
}